

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall checkqueue_tests::test_CheckQueue_Memory::test_method(test_CheckQueue_Memory *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  iterator in_R8;
  atomic<unsigned_long> *in_R9;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  long local_c8;
  char *local_a8;
  char *local_a0;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  bool local_51;
  __single_object queue;
  CCheckQueueControl<MemoryCheck> control;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<MemoryCheck>,unsigned_int_const&,int_const&>
            ((uint *)&queue,(int *)&QUEUE_BATCH_SIZE);
  local_c8 = -1;
  for (uVar6 = 0; uVar6 != 1000; uVar6 = uVar6 + 1) {
    CCheckQueueControl<MemoryCheck>::CCheckQueueControl
              (&control,(CCheckQueue<FakeCheckCheckCompletion> *)
                        queue._M_t.
                        super___uniq_ptr_impl<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_CCheckQueue<MemoryCheck>_*,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
                        .super__Head_base<0UL,_CCheckQueue<MemoryCheck>_*,_false>._M_head_impl);
    for (uVar5 = uVar6; uVar5 != 0; uVar5 = uVar5 + lVar4) {
      iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                        (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_NoLockLoggingTestingSetup
                          .super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                          super_RandomMixin<FastRandomContext>,10);
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar3 = (long)iVar2;
      if (uVar5 < (ulong)(long)iVar2) {
        uVar3 = uVar5;
      }
      for (lVar4 = 0; -lVar4 != uVar3; lVar4 = lVar4 + -1) {
        local_51 = (~(uVar6 >> 1) + uVar5 + lVar4 == 0 || local_c8 + uVar5 + lVar4 == 0) ||
                   lVar4 + uVar5 == 1;
        std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::emplace_back<bool>
                  ((vector<MemoryCheck,_std::allocator<MemoryCheck>_> *)&vChecks,&local_51);
      }
      CCheckQueueControl<MemoryCheck>::Add(&control,&vChecks);
      std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::~vector
                ((vector<MemoryCheck,_std::allocator<MemoryCheck>_> *)&vChecks);
    }
    CCheckQueueControl<MemoryCheck>::~CCheckQueueControl(&control);
    local_68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_60 = "";
    local_78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x13e;
    file.m_begin = (iterator)&local_68;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)vChecks.
                          super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    local_a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_a0 = "";
    control.pqueue._0_4_ = 0;
    in_R8 = (iterator)0x2;
    in_R9 = &MemoryCheck::fake_allocated_memory;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::atomic<unsigned_long>,unsigned_int>
              ((vector<MemoryCheck,_std::allocator<MemoryCheck>_> *)&vChecks,&local_a8,0x13e);
    local_c8 = local_c8 + -1;
  }
  std::unique_ptr<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>::
  ~unique_ptr(&queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Memory)
{
    auto queue = std::make_unique<Memory_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    for (size_t i = 0; i < 1000; ++i) {
        size_t total = i;
        {
            CCheckQueueControl<MemoryCheck> control(queue.get());
            while (total) {
                size_t r = m_rng.randrange(10);
                std::vector<MemoryCheck> vChecks;
                for (size_t k = 0; k < r && total; k++) {
                    total--;
                    // Each iteration leaves data at the front, back, and middle
                    // to catch any sort of deallocation failure
                    vChecks.emplace_back(total == 0 || total == i || total == i/2);
                }
                control.Add(std::move(vChecks));
            }
        }
        BOOST_REQUIRE_EQUAL(MemoryCheck::fake_allocated_memory, 0U);
    }
}